

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

SegmentAnd<capnp::word_*>
capnp::_::WireHelpers::setStructPointer
          (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *ref,StructReader value,
          BuilderArena *orphanArena,bool canonical)

{
  BuilderArena *this;
  word *pwVar1;
  ulong uVar2;
  SegmentWordCount amount;
  SegmentBuilder *pSVar3;
  uint uVar4;
  WirePointer *pWVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  undefined7 in_register_00000081;
  word *pwVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  bool bVar15;
  AllocateResult AVar16;
  SegmentAnd<capnp::word_*> SVar17;
  bool _kjCondition;
  word *local_68;
  anon_class_1_0_00000001 local_59;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  CapTableBuilder *local_40;
  Fault f;
  
  iVar9 = (int)CONCAT71(in_register_00000081,canonical);
  uVar13 = (ulong)value.dataSize;
  uVar14 = value.dataSize + 7 >> 3;
  uVar8 = (ulong)uVar14;
  uVar11 = (uint)value.pointerCount;
  local_40 = capTable;
  if (iVar9 != 0) {
    bVar15 = ((undefined1  [48])value & (undefined1  [48])0x7) == (undefined1  [48])0x0;
    _kjCondition = bVar15 || uVar13 == 1;
    if (!bVar15 && uVar13 != 1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x6f0,FAILED,
                 "(value.dataSize == ONE * BITS) || (value.dataSize % BITS_PER_BYTE == ZERO * BITS)"
                 ,"_kjCondition,",&_kjCondition);
      kj::_::Debug::Fault::fatal(&f);
    }
    if (value.dataSize == 1) {
      if ((*value.data & 1) == 0) {
        uVar8 = 0;
      }
    }
    else {
      uVar2 = (ulong)(value.dataSize >> 3);
      do {
        uVar8 = uVar2;
        if ((void *)(uVar8 + (long)value.data) <= value.data) break;
        uVar2 = uVar8 - 1;
      } while (*(char *)((long)value.data + (uVar8 - 1)) == '\0');
    }
    uVar14 = (uint)uVar8;
    lVar7 = (ulong)value.pointerCount << 3;
    do {
      lVar12 = lVar7;
      pWVar5 = (WirePointer *)((long)&((value.pointers)->offsetAndKind).value + lVar12);
      if (pWVar5 <= value.pointers) break;
      lVar7 = lVar12 + -8;
    } while (pWVar5[-1].field_1.upper32Bits == 0 && pWVar5[-1].offsetAndKind.value == 0);
    uVar11 = (uint)lVar12 >> 3;
  }
  uVar4 = uVar14 + 7 >> 3;
  local_48 = (ulong)uVar4;
  local_50 = (ulong)(uVar11 & 0xffff);
  uVar4 = uVar4 + (uVar11 & 0xffff);
  if (orphanArena == (BuilderArena *)0x0) {
    uVar8 = (ulong)uVar4;
    if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
      local_68 = (word *)CONCAT44(local_68._4_4_,iVar9);
      local_58 = (ulong)uVar4;
      zeroObject(segment,capTable,ref);
      canonical = SUB81(local_68,0);
      uVar8 = local_58;
    }
    uVar4 = (uint)uVar8;
    if (uVar4 == 0) {
      (ref->offsetAndKind).value = 0xfffffffc;
      AVar16.words = (word *)ref;
      AVar16.segment = segment;
    }
    else {
      pwVar10 = segment->pos;
      AVar16.words = pwVar10;
      AVar16.segment = segment;
      if (((long)((long)(segment->super_SegmentReader).ptr.ptr +
                 ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pwVar10)) >> 3 <
           (long)(uVar8 & 0xffffffff)) ||
         (segment->pos = pwVar10 + (uVar8 & 0xffffffff), pwVar10 == (word *)0x0)) {
        this = (BuilderArena *)(segment->super_SegmentReader).arena;
        amount = uVar4 + 1;
        local_68 = (word *)uVar13;
        if (0x1ffffffe < uVar4) {
          local_58 = CONCAT44(local_58._4_4_,uVar4 + 1);
          allocate::anon_class_1_0_00000001::operator()(&local_59);
          amount = (SegmentWordCount)local_58;
        }
        AVar16 = BuilderArena::allocate(this,amount);
        pWVar5 = (WirePointer *)AVar16.words;
        pSVar3 = AVar16.segment;
        (ref->offsetAndKind).value =
             (int)AVar16.words - *(int *)&(pSVar3->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
        ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                       (pSVar3->super_SegmentReader).id.value;
        (pWVar5->offsetAndKind).value = 0;
        AVar16.words = (word *)(pWVar5 + 1);
        AVar16.segment = pSVar3;
        value.dataSize = (StructDataBitCount)local_68;
        ref = pWVar5;
      }
      else {
        (ref->offsetAndKind).value =
             ((uint)((ulong)((long)pwVar10 - (long)ref) >> 1) & 0xfffffffc) - 4;
      }
    }
  }
  else {
    AVar16 = BuilderArena::allocate(orphanArena,uVar4);
    (ref->offsetAndKind).value = 0xfffffffc;
  }
  local_68 = AVar16.words;
  (ref->field_1).structRef.dataSize.value = (unsigned_short)local_48;
  (ref->field_1).structRef.ptrCount.value = (unsigned_short)uVar11;
  if (value.dataSize == 1) {
    if (uVar14 != 0) {
      *(byte *)&local_68->content = *value.data & 1;
    }
  }
  else if (uVar14 != 0) {
    memcpy(local_68,value.data,(ulong)uVar14);
  }
  if ((unsigned_short)uVar11 != 0) {
    pWVar5 = (WirePointer *)(local_68 + (local_48 & 0xffffffff));
    local_50 = (ulong)(uint)((int)local_50 << 3);
    lVar12 = 8;
    lVar7 = -8;
    do {
      lVar6 = (long)(*(int *)((long)&value.pointers[-1].offsetAndKind.value + lVar12) >> 2);
      if (value.segment == (SegmentReader *)0x0) {
        pwVar10 = (word *)((long)&value.pointers[lVar6].offsetAndKind.value + lVar12);
      }
      else {
        pwVar1 = ((value.segment)->ptr).ptr;
        pwVar10 = pwVar1 + ((value.segment)->ptr).size_;
        if (((long)pwVar1 + (lVar7 - (long)value.pointers) >> 3 <= lVar6) &&
           (lVar6 <= (long)pwVar10 + (lVar7 - (long)value.pointers) >> 3)) {
          pwVar10 = (word *)((long)&value.pointers[lVar6].offsetAndKind.value + lVar12);
        }
      }
      copyPointer(AVar16.segment,local_40,pWVar5,value.segment,value.capTable,
                  (WirePointer *)((long)&value.pointers[-1].offsetAndKind.value + lVar12),pwVar10,
                  value.nestingLimit,(BuilderArena *)0x0,canonical);
      pWVar5 = pWVar5 + 1;
      lVar12 = lVar12 + 8;
      lVar6 = local_50 + lVar7;
      lVar7 = lVar7 + -8;
    } while (lVar6 != 0);
  }
  SVar17.value = local_68;
  SVar17.segment = AVar16.segment;
  return SVar17;
}

Assistant:

static SegmentAnd<word*> setStructPointer(
      SegmentBuilder* segment, CapTableBuilder* capTable, WirePointer* ref, StructReader value,
      BuilderArena* orphanArena = nullptr, bool canonical = false) {
    auto dataSize = roundBitsUpToBytes(value.dataSize);
    auto ptrCount = value.pointerCount;

    if (canonical) {
      // StructReaders should not have bitwidths other than 1, but let's be safe
      KJ_REQUIRE((value.dataSize == ONE * BITS)
                 || (value.dataSize % BITS_PER_BYTE == ZERO * BITS));

      if (value.dataSize == ONE * BITS) {
        // Handle the truncation case where it's a false in a 1-bit struct
        if (!value.getDataField<bool>(ZERO * ELEMENTS)) {
          dataSize = ZERO * BYTES;
        }
      } else {
        // Truncate the data section
        auto data = value.getDataSectionAsBlob();
        auto end = data.end();
        while (end > data.begin() && end[-1] == 0) --end;
        dataSize = intervalLength(data.begin(), end, MAX_STRUCT_DATA_WORDS * BYTES_PER_WORD);
      }

      // Truncate pointer section
      const WirePointer* ptr = value.pointers + ptrCount;
      while (ptr > value.pointers && ptr[-1].isNull()) --ptr;
      ptrCount = intervalLength(value.pointers, ptr, MAX_STRUCT_POINTER_COUNT);
    }

    auto dataWords = roundBytesUpToWords(dataSize);

    auto totalSize = dataWords + ptrCount * WORDS_PER_POINTER;

    word* ptr = allocate(ref, segment, capTable, totalSize, WirePointer::STRUCT, orphanArena);
    ref->structRef.set(dataWords, ptrCount);

    if (value.dataSize == ONE * BITS) {
      // Data size could be made 0 by truncation
      if (dataSize != ZERO * BYTES) {
        *reinterpret_cast<char*>(ptr) = value.getDataField<bool>(ZERO * ELEMENTS);
      }
    } else {
      copyMemory(reinterpret_cast<byte*>(ptr),
                 reinterpret_cast<const byte*>(value.data),
                 dataSize);
    }

    WirePointer* pointerSection = reinterpret_cast<WirePointer*>(ptr + dataWords);
    for (auto i: kj::zeroTo(ptrCount)) {
      copyPointer(segment, capTable, pointerSection + i,
                  value.segment, value.capTable, value.pointers + i,
                  value.nestingLimit, nullptr, canonical);
    }

    return { segment, ptr };
  }